

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptSetIterator.cpp
# Opt level: O2

Var Js::JavascriptSetIterator::EntryNext(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  JavascriptLibrary *this;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Var aValue;
  JavascriptSetIterator *pJVar5;
  JavascriptArray *pJVar6;
  DynamicObject *pDVar7;
  JavascriptArray *value;
  int in_stack_00000010;
  undefined1 local_38 [8];
  ArgumentReader args;
  CallInfo callInfo_local;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptSetIterator.cpp"
                                ,0x16,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00bb9c2b;
    *puVar4 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)local_38,(CallInfo *)&args.super_Arguments.Values,
             (Var *)&stack0x00000018);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  this = (pSVar1->super_ScriptContextBase).javascriptLibrary;
  if (((ulong)args.super_Arguments.Values & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptSetIterator.cpp"
                                ,0x1a,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) goto LAB_00bb9c2b;
    *puVar4 = 0;
  }
  aValue = Arguments::operator[]((Arguments *)local_38,0);
  bVar3 = VarIs<Js::JavascriptSetIterator>(aValue);
  if (!bVar3) {
    JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ebf2,L"Set Iterator.prototype.next");
  }
  pJVar5 = VarTo<Js::JavascriptSetIterator>(aValue);
  if (((pJVar5->m_set).ptr == (JavascriptSet *)0x0) ||
     (bVar3 = MapOrSetDataList<void_*>::Iterator::Next(&pJVar5->m_setIterator), !bVar3)) {
    (pJVar5->m_set).ptr = (JavascriptSet *)0x0;
    pDVar7 = JavascriptLibrary::CreateIteratorResultObjectDone(this);
    return pDVar7;
  }
  value = (JavascriptArray *)(((pJVar5->m_setIterator).current.ptr)->data).ptr;
  if (pJVar5->m_kind != Value) {
    if (pJVar5->m_kind == KeyAndValue) {
      pJVar6 = JavascriptLibrary::CreateArray(this,2);
      (*(pJVar6->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
        super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
                (pJVar6,0,value,0);
      (*(pJVar6->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
        super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
                (pJVar6,1,value,0);
      value = pJVar6;
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptSetIterator.cpp"
                                  ,0x39,"(iterator->m_kind == JavascriptSetIteratorKind::Value)",
                                  "iterator->m_kind == JavascriptSetIteratorKind::Value");
      if (!bVar3) {
LAB_00bb9c2b:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
    }
  }
  pDVar7 = JavascriptLibrary::CreateIteratorResultObject(this,value,false);
  return pDVar7;
}

Assistant:

Var JavascriptSetIterator::EntryNext(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();
        JavascriptLibrary* library = scriptContext->GetLibrary();

        Assert(!(callInfo.Flags & CallFlags_New));

        Var thisObj = args[0];

        if (!VarIs<JavascriptSetIterator>(thisObj))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedSetIterator, _u("Set Iterator.prototype.next"));
        }

        JavascriptSetIterator* iterator = VarTo<JavascriptSetIterator>(thisObj);
        JavascriptSet* set = iterator->m_set;
        auto& setIterator = iterator->m_setIterator;

        if (set == nullptr || !setIterator.Next())
        {
            iterator->m_set = nullptr;
            return library->CreateIteratorResultObjectDone();
        }

        auto value = setIterator.Current();
        Var result;

        if (iterator->m_kind == JavascriptSetIteratorKind::KeyAndValue)
        {
            JavascriptArray* keyValueTuple = library->CreateArray(2);
            keyValueTuple->SetItem(0, value, PropertyOperation_None);
            keyValueTuple->SetItem(1, value, PropertyOperation_None);
            result = keyValueTuple;
        }
        else
        {
            Assert(iterator->m_kind == JavascriptSetIteratorKind::Value);
            result = value;
        }

        return library->CreateIteratorResultObject(result);
    }